

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiViewportP::~ImGuiViewportP(ImGuiViewportP *this)

{
  ImGuiViewport *in_RDI;
  ImDrawDataBuilder *unaff_retaddr;
  
  if (in_RDI[1].RendererUserData != (void *)0x0) {
    IM_DELETE<ImDrawList>((ImDrawList *)0x1dfc7e);
  }
  if (in_RDI[1].PlatformUserData != (void *)0x0) {
    IM_DELETE<ImDrawList>((ImDrawList *)0x1dfca2);
  }
  ImDrawDataBuilder::~ImDrawDataBuilder(unaff_retaddr);
  ImDrawData::~ImDrawData((ImDrawData *)0x1dfcc8);
  ImGuiViewport::~ImGuiViewport(in_RDI);
  return;
}

Assistant:

~ImGuiViewportP()           { if (DrawLists[0]) IM_DELETE(DrawLists[0]); if (DrawLists[1]) IM_DELETE(DrawLists[1]); }